

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

error arc::lex(char *str,char **start,char **end)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *prefix;
  char *delim;
  char *ws;
  char **end_local;
  char **start_local;
  char *str_local;
  
  start_local = (char **)str;
  while( true ) {
    sVar3 = strspn((char *)start_local," \t\r\n");
    start_local = (char **)(sVar3 + (long)start_local);
    if (*(char *)start_local == '\0') {
      *end = (char *)0x0;
      *start = (char *)0x0;
      return ERROR_FILE;
    }
    *start = (char *)start_local;
    pcVar4 = strchr("()[]\'`",(int)*(char *)start_local);
    if (pcVar4 != (char *)0x0) {
      *end = (char *)((long)start_local + 1);
      return ERROR_OK;
    }
    if (*(char *)start_local == ',') {
      iVar2 = 1;
      if (*(char *)((long)start_local + 1) == '@') {
        iVar2 = 2;
      }
      *end = (char *)((long)start_local + (long)iVar2);
      return ERROR_OK;
    }
    if (*(char *)start_local == '\"') break;
    if (*(char *)start_local != ';') {
      sVar3 = strcspn((char *)start_local,"()[] \t\r\n;");
      *end = (char *)((long)start_local + sVar3);
      return ERROR_OK;
    }
    sVar3 = strcspn((char *)start_local,"\n");
    start_local = (char **)(sVar3 + (long)start_local);
  }
  do {
    while( true ) {
      ppcVar1 = start_local;
      start_local = (char **)((long)ppcVar1 + 1);
      if (*(char *)start_local == '\0') {
        return ERROR_FILE;
      }
      if (*(char *)start_local != '\\') break;
      start_local = (char **)((long)ppcVar1 + 2);
    }
  } while (*(char *)start_local != '\"');
  *end = (char *)((long)ppcVar1 + 2);
  return ERROR_OK;
}

Assistant:

error lex(const char* str, const char** start, const char** end)
	{
		const char* ws = " \t\r\n";
		const char* delim = "()[] \t\r\n;";
		const char* prefix = "()[]'`";
	start:
		str += strspn(str, ws);

		if (str[0] == '\0') {
			*start = *end = NULL;
			return ERROR_FILE;
		}

		*start = str;

		if (strchr(prefix, str[0]) != NULL)
			*end = str + 1;
		else if (str[0] == ',')
			*end = str + (str[1] == '@' ? 2 : 1);
		else if (str[0] == '"') {
			str++;
			while (1) {
				if (*str == 0) return ERROR_FILE; /* string not terminated */
				if (*str == '\\') str++;
				else if (*str == '"') {
					break;
				}
				str++;
			}
			*end = str + 1;
		}
		else if (str[0] == ';') { /* end-of-line comment */
			str += strcspn(str, "\n");
			goto start;
		}
		else
			*end = str + strcspn(str, delim);

		return ERROR_OK;
	}